

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int ConnectHokuyo(HOKUYO *pHokuyo,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  undefined1 local_4145;
  int local_4144;
  undefined4 uStack_4140;
  char Sum;
  int Status;
  int ivalue;
  int recvbuflen;
  char recvbuf [8192];
  uint8 local_2128 [4];
  int sendbuflen;
  char sendbuf [8192];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  HOKUYO *pHokuyo_local;
  
  Status = 0;
  uStack_4140 = 0;
  local_4144 = 0;
  local_4145 = 0;
  memset(pHokuyo->szCfgFilePath,0,0x100);
  sprintf(pHokuyo->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(sendbuf + 0x1ff8,0,0x100);
    memset(pHokuyo->szDevPath,0,0x100);
    sprintf(pHokuyo->szDevPath,"COM1");
    pHokuyo->BaudRate = 0x1c200;
    pHokuyo->timeout = 1000;
    pHokuyo->threadperiod = 100;
    pHokuyo->bSaveRawData = 1;
    pHokuyo->bForceSCIP20 = 0;
    pHokuyo->bHS = 0;
    pHokuyo->SlitDivision = 0x400;
    pHokuyo->StartingStep = 0x2c;
    pHokuyo->FrontStep = 0x180;
    pHokuyo->EndStep = 0x2d5;
    pHokuyo->ClusterCount = 0;
    pHokuyo->ScanInterval = 0;
    pHokuyo->bContinuousNumberOfScans = 1;
    pHokuyo->alpha_max_err = 0.01;
    pHokuyo->d_max_err = 0.1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%255s",pHokuyo->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->bForceSCIP20);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->bHS);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->SlitDivision);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->StartingStep);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->FrontStep);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->EndStep);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->ClusterCount);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->ScanInterval);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%d",&pHokuyo->bContinuousNumberOfScans);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%lf",&pHokuyo->alpha_max_err);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,sendbuf + 0x1ff8,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(sendbuf + 0x1ff8,"%lf",&pHokuyo->d_max_err);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose(__stream);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pHokuyo->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pHokuyo->threadperiod = 100;
  }
  if (pHokuyo->SlitDivision < 1) {
    printf("Invalid parameter : SlitDivision.\n");
    pHokuyo->SlitDivision = 0x400;
  }
  if (pHokuyo->ClusterCount < 0) {
    printf("Invalid parameter : ClusterCount.\n");
    pHokuyo->ClusterCount = 0;
  }
  pHokuyo->StepAngleSize =
       ((double)(pHokuyo->ClusterCount + 1) * 360.0) / (double)pHokuyo->SlitDivision;
  pHokuyo->StepCount =
       ((pHokuyo->EndStep - pHokuyo->StartingStep) + 1) / (pHokuyo->ClusterCount + 1);
  iVar1 = OpenRS232Port(&pHokuyo->RS232Port,pHokuyo->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pHokuyo->RS232Port,pHokuyo->BaudRate,'\0',0,'\b','\0',
                                pHokuyo->timeout);
    if (iVar1 == 0) {
      if (pHokuyo->bForceSCIP20 != 0) {
        memset(local_2128,0,0x2000);
        strcpy((char *)local_2128,"SCIP2.0\n");
        sVar3 = strlen((char *)local_2128);
        iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,local_2128,(int)sVar3);
        if (iVar1 != 0) {
          printf("Unable to connect to a Hokuyo.\n");
          CloseRS232Port(&pHokuyo->RS232Port);
          return 1;
        }
        memset(&ivalue,0,0x2000);
        Status = 0xc;
        iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&ivalue,0xc);
        if (iVar1 != 0) {
          printf("Unable to connect to a Hokuyo.\n");
          CloseRS232Port(&pHokuyo->RS232Port);
          return 1;
        }
        iVar1 = strcmp((char *)&ivalue,"SCIP2.0\n00\n\n");
        if (iVar1 != 0) {
          printf("Unable to connect to a Hokuyo.\n");
          CloseRS232Port(&pHokuyo->RS232Port);
          return 1;
        }
      }
      memset(local_2128,0,0x2000);
      strcpy((char *)local_2128,"RS\n");
      sVar3 = strlen((char *)local_2128);
      iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,local_2128,(int)sVar3);
      if (iVar1 == 0) {
        memset(&ivalue,0,0x2000);
        Status = 8;
        iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&ivalue,8);
        if (iVar1 == 0) {
          iVar1 = strcmp((char *)&ivalue,"RS\n00P\n\n");
          if (iVar1 == 0) {
            memset(local_2128,0,0x2000);
            strcpy((char *)local_2128,"BM\n");
            sVar3 = strlen((char *)local_2128);
            iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,local_2128,(int)sVar3);
            if (iVar1 == 0) {
              memset(&ivalue,0,0x2000);
              Status = 8;
              iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&ivalue,8);
              if (iVar1 == 0) {
                local_4144 = 0;
                local_4145 = 0;
                iVar1 = __isoc99_sscanf(&ivalue,"BM\n%02d%c\n\n",&local_4144,&local_4145);
                if ((iVar1 == 2) && ((local_4144 == 0 || (local_4144 == 2)))) {
                  if (pHokuyo->bHS != 0) {
                    memset(local_2128,0,0x2000);
                    strcpy((char *)local_2128,"HS1\n");
                    sVar3 = strlen((char *)local_2128);
                    iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,local_2128,(int)sVar3);
                    if (iVar1 != 0) {
                      printf("Unable to connect to a Hokuyo : HS command failure.\n");
                      CloseRS232Port(&pHokuyo->RS232Port);
                      return 1;
                    }
                    memset(&ivalue,0,0x2000);
                    Status = 9;
                    iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&ivalue,9);
                    if (iVar1 != 0) {
                      printf("Unable to connect to a Hokuyo : HS command failure.\n");
                      CloseRS232Port(&pHokuyo->RS232Port);
                      return 1;
                    }
                    uStack_4140 = 0;
                    local_4144 = 0;
                    local_4145 = 0;
                    iVar1 = __isoc99_sscanf(&ivalue,"HS%01d\n%02d%c\n\n",&stack0xffffffffffffbec0,
                                            &local_4144,&local_4145);
                    if ((iVar1 != 3) || ((local_4144 != 0 && (local_4144 != 2)))) {
                      printf("Unable to connect to a Hokuyo : HS command failure.\n");
                      CloseRS232Port(&pHokuyo->RS232Port);
                      return 1;
                    }
                  }
                  memset(local_2128,0,0x2000);
                  sprintf((char *)local_2128,"MD%04d%04d%02d%01d00\n",
                          (ulong)(uint)pHokuyo->StartingStep,(ulong)(uint)pHokuyo->EndStep,
                          (ulong)(uint)pHokuyo->ClusterCount,(ulong)(uint)pHokuyo->ScanInterval);
                  sVar3 = strlen((char *)local_2128);
                  iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,local_2128,(int)sVar3);
                  if (iVar1 == 0) {
                    memset(&ivalue,0,0x2000);
                    Status = 0x15;
                    iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&ivalue,0x15);
                    if (iVar1 == 0) {
                      uStack_4140 = 0;
                      iVar1 = __isoc99_sscanf(&ivalue,"MD%04d%04d%02d%01d%02d\n00P\n\n",
                                              &stack0xffffffffffffbec0,&stack0xffffffffffffbec0,
                                              &stack0xffffffffffffbec0,&stack0xffffffffffffbec0,
                                              &stack0xffffffffffffbec0);
                      if (iVar1 == 5) {
                        printf("Hokuyo connected.\n");
                        pHokuyo_local._4_4_ = 0;
                      }
                      else {
                        printf("Unable to connect to a Hokuyo : MD command failure.\n");
                        CloseRS232Port(&pHokuyo->RS232Port);
                        pHokuyo_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("Unable to connect to a Hokuyo : MD command failure.\n");
                      CloseRS232Port(&pHokuyo->RS232Port);
                      pHokuyo_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("Unable to connect to a Hokuyo : MD command failure.\n");
                    CloseRS232Port(&pHokuyo->RS232Port);
                    pHokuyo_local._4_4_ = 1;
                  }
                }
                else {
                  printf("Unable to connect to a Hokuyo : BM command failure.\n");
                  CloseRS232Port(&pHokuyo->RS232Port);
                  pHokuyo_local._4_4_ = 1;
                }
              }
              else {
                printf("Unable to connect to a Hokuyo : BM command failure.\n");
                CloseRS232Port(&pHokuyo->RS232Port);
                pHokuyo_local._4_4_ = 1;
              }
            }
            else {
              printf("Unable to connect to a Hokuyo : BM command failure.\n");
              CloseRS232Port(&pHokuyo->RS232Port);
              pHokuyo_local._4_4_ = 1;
            }
          }
          else {
            printf("Unable to connect to a Hokuyo : RS command failure.\n");
            CloseRS232Port(&pHokuyo->RS232Port);
            pHokuyo_local._4_4_ = 1;
          }
        }
        else {
          printf("Unable to connect to a Hokuyo : RS command failure.\n");
          CloseRS232Port(&pHokuyo->RS232Port);
          pHokuyo_local._4_4_ = 1;
        }
      }
      else {
        printf("Unable to connect to a Hokuyo : RS command failure.\n");
        CloseRS232Port(&pHokuyo->RS232Port);
        pHokuyo_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a Hokuyo.\n");
      CloseRS232Port(&pHokuyo->RS232Port);
      pHokuyo_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a Hokuyo.\n");
    pHokuyo_local._4_4_ = 1;
  }
  return pHokuyo_local._4_4_;
}

Assistant:

inline int ConnectHokuyo(HOKUYO* pHokuyo, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char sendbuf[MAX_NB_BYTES_HOKUYO];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_HOKUYO];
	int recvbuflen = 0;
	int ivalue = 0, Status = 0;
	char Sum = 0;

	memset(pHokuyo->szCfgFilePath, 0, sizeof(pHokuyo->szCfgFilePath));
	sprintf(pHokuyo->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pHokuyo->szDevPath, 0, sizeof(pHokuyo->szDevPath));
		sprintf(pHokuyo->szDevPath, "COM1");
		pHokuyo->BaudRate = 115200;
		pHokuyo->timeout = 1000;
		pHokuyo->threadperiod = 100;
		pHokuyo->bSaveRawData = 1;
		pHokuyo->bForceSCIP20 = 0;
		pHokuyo->bHS = 0;
		pHokuyo->SlitDivision = 1024;
		pHokuyo->StartingStep = 44;
		pHokuyo->FrontStep = 384;
		pHokuyo->EndStep = 725;
		pHokuyo->ClusterCount = 0;
		pHokuyo->ScanInterval = 0;
		pHokuyo->bContinuousNumberOfScans = 1;
		pHokuyo->alpha_max_err = 0.01;
		pHokuyo->d_max_err = 0.1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pHokuyo->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bForceSCIP20) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bHS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->SlitDivision) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->StartingStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->FrontStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->EndStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->ClusterCount) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->ScanInterval) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bContinuousNumberOfScans) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pHokuyo->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pHokuyo->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pHokuyo->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pHokuyo->threadperiod = 100;
	}
	if (pHokuyo->SlitDivision <= 0)
	{
		printf("Invalid parameter : SlitDivision.\n");
		pHokuyo->SlitDivision = 1024;
	}
	if (pHokuyo->ClusterCount < 0)
	{
		printf("Invalid parameter : ClusterCount.\n");
		pHokuyo->ClusterCount = 0;
	}
		
	pHokuyo->StepAngleSize = 360.0*(pHokuyo->ClusterCount+1)/pHokuyo->SlitDivision;
	pHokuyo->StepCount = (pHokuyo->EndStep-pHokuyo->StartingStep+1)/(pHokuyo->ClusterCount+1);

	// Used to save raw data, should be handled specifically...
	//pHokuyo->pfSaveFile = NULL;

	if (OpenRS232Port(&pHokuyo->RS232Port, pHokuyo->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pHokuyo->RS232Port, pHokuyo->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pHokuyo->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	if (pHokuyo->bForceSCIP20)
	{	
		// Force SCIP2.0 mode.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		strcpy(sendbuf, "SCIP2.0\n");
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 12;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		if (strcmp(recvbuf, "SCIP2.0\n00\n\n") != 0)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}
	}
	
	// RS command to reset.
	
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "RS\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
		
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 8;

	if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// Check response.
	if (strcmp(recvbuf, "RS\n00P\n\n") != 0)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// BM command to switch on the laser.

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "BM\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
		
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 8;

	if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// Check response.
	Status = 0; Sum = 0;
	if ((sscanf(recvbuf, "BM\n%02d%c\n\n", &Status, &Sum) != 2)||((Status != 0)&&(Status != 2)))
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
	
	if (pHokuyo->bHS)
	{
		// HS command to activate high sensitivity if available.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		strcpy(sendbuf, "HS1\n");
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 9;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		ivalue = 0; Status = 0; Sum = 0;
		if ((sscanf(recvbuf, "HS%01d\n%02d%c\n\n", &ivalue, &Status, &Sum) != 3)||((Status != 0)&&(Status != 2)))
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}
	}

	// Other mode not yet handled...

	//if (pHokuyo->bContinuousNumberOfScans)
	{
		// MD command to start data acquisition.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sprintf(sendbuf, "MD%04d%04d%02d%01d00\n", pHokuyo->StartingStep, pHokuyo->EndStep, pHokuyo->ClusterCount, pHokuyo->ScanInterval);
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 21;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		ivalue = 0;
		if (sscanf(recvbuf, "MD%04d%04d%02d%01d%02d\n00P\n\n", &ivalue, &ivalue, &ivalue, &ivalue, &ivalue) != 5)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// checking...
		// sscanf("echo...%02d%c\n\n", &Status, &Sum);
		// status == 0

	}
	
	printf("Hokuyo connected.\n");

	return EXIT_SUCCESS;
}